

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::DCT_Upsample::R_S<5,_6>::calc(Matrix44 *R,Matrix44 *S,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  
  sVar1 = pSrc[1];
  sVar2 = pSrc[3];
  sVar3 = pSrc[5];
  sVar4 = pSrc[9];
  sVar5 = pSrc[0xb];
  sVar6 = pSrc[0xd];
  sVar7 = pSrc[0x11];
  sVar8 = pSrc[0x13];
  sVar9 = pSrc[0x15];
  sVar10 = pSrc[0x19];
  sVar11 = pSrc[0x1b];
  sVar12 = pSrc[0x1d];
  sVar13 = pSrc[0x21];
  sVar14 = pSrc[0x23];
  sVar15 = pSrc[0x25];
  sVar16 = pSrc[2];
  iVar24 = (int)pSrc[10];
  sVar17 = pSrc[0x12];
  iVar20 = (int)pSrc[0x1a];
  sVar18 = pSrc[0x22];
  R->v[0][0] = sVar3 * 0xda + 0x200 + sVar2 * -0x145 + sVar1 * 0x3a0 >> 10;
  iVar21 = sVar6 * 0xda + 0x200 + sVar5 * -0x145 + sVar4 * 0x3a0 >> 10;
  iVar23 = sVar12 * 0xda + 0x200 + sVar11 * -0x145 + sVar10 * 0x3a0 >> 10;
  R->v[0][1] = iVar23 * 0x32a + iVar21 * 0x1aa + 0x200 >> 10;
  R->v[0][2] = sVar15 * 0xda + 0x200 + sVar14 * -0x145 + sVar13 * 0x3a0 >> 10;
  R->v[0][3] = iVar23 * -99 + iVar21 * 0x17 + 0x200 >> 10;
  R->v[1][0] = (int)sVar16;
  R->v[1][1] = iVar20 * 0x32a + iVar24 * 0x1aa + 0x200 >> 10;
  R->v[1][2] = (int)sVar18;
  R->v[1][3] = iVar20 * -99 + iVar24 * 0x17 + 0x200 >> 10;
  iVar22 = sVar6 * 0x313 + 0x200 + sVar5 * 0x20e + sVar4 * -0x4b >> 10;
  iVar19 = sVar12 * 0x313 + 0x200 + sVar11 * 0x20e + sVar10 * -0x4b >> 10;
  R->v[2][0] = sVar3 * 0x313 + 0x200 + sVar2 * 0x20e + sVar1 * -0x4b >> 10;
  R->v[2][1] = iVar19 * 0x32a + iVar22 * 0x1aa + 0x200 >> 10;
  R->v[2][2] = sVar15 * 0x313 + 0x200 + sVar14 * 0x20e + sVar13 * -0x4b >> 10;
  R->v[2][3] = iVar19 * -99 + iVar22 * 0x17 + 0x200 >> 10;
  *(Element_Type *)((long)(R->v + 3) + 0) = 0;
  *(Element_Type *)((long)(R->v + 3) + 4) = 0;
  *(Element_Type *)((long)(R->v + 3) + 8) = 0;
  *(Element_Type *)((long)(R->v + 3) + 0xc) = 0;
  S->v[0][0] = iVar23 * -0x145 + iVar21 * 0x3a0 + 0x200 >> 10;
  S->v[0][1] = sVar9 * 0xda + 0x200 + sVar8 * -0x145 + sVar7 * 0x3a0 >> 10;
  S->v[0][2] = iVar23 * 0x20e + iVar21 * -0x4b + 0x200 >> 10;
  S->v[0][3] = 0;
  S->v[1][0] = iVar20 * -0x145 + iVar24 * 0x3a0 + 0x200 >> 10;
  S->v[1][1] = (int)sVar17;
  S->v[1][2] = iVar20 * 0x20e + iVar24 * -0x4b + 0x200 >> 10;
  S->v[1][3] = 0;
  S->v[2][0] = iVar19 * -0x145 + iVar22 * 0x3a0 + 0x200 >> 10;
  S->v[2][1] = sVar9 * 0x313 + 0x200 + sVar8 * 0x20e + sVar7 * -0x4b >> 10;
  S->v[2][2] = iVar19 * 0x20e + iVar22 * -0x4b + 0x200 >> 10;
  *(undefined8 *)(S->v[2] + 3) = 0;
  *(Element_Type *)((long)(S->v + 3) + 4) = 0;
  *(Element_Type *)((long)(S->v + 3) + 8) = 0;
  S->v[3][3] = 0;
  return;
}

Assistant:

static void calc(Matrix44& R, Matrix44& S, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X100 = D(F(0.906127f) * AT(1, 0) + F(-0.318190f) * AT(3, 0) + F(0.212608f) * AT(5, 0) + F(-0.180240f) * AT(7, 0));
      const Temp_Type X101 = D(F(0.906127f) * AT(1, 1) + F(-0.318190f) * AT(3, 1) + F(0.212608f) * AT(5, 1) + F(-0.180240f) * AT(7, 1));
      const Temp_Type X102 = D(F(0.906127f) * AT(1, 2) + F(-0.318190f) * AT(3, 2) + F(0.212608f) * AT(5, 2) + F(-0.180240f) * AT(7, 2));
      const Temp_Type X103 = D(F(0.906127f) * AT(1, 3) + F(-0.318190f) * AT(3, 3) + F(0.212608f) * AT(5, 3) + F(-0.180240f) * AT(7, 3));
      const Temp_Type X104 = D(F(0.906127f) * AT(1, 4) + F(-0.318190f) * AT(3, 4) + F(0.212608f) * AT(5, 4) + F(-0.180240f) * AT(7, 4));
      const Temp_Type X105 = D(F(0.906127f) * AT(1, 5) + F(-0.318190f) * AT(3, 5) + F(0.212608f) * AT(5, 5) + F(-0.180240f) * AT(7, 5));
      const Temp_Type X106 = D(F(0.906127f) * AT(1, 6) + F(-0.318190f) * AT(3, 6) + F(0.212608f) * AT(5, 6) + F(-0.180240f) * AT(7, 6));
      const Temp_Type X107 = D(F(0.906127f) * AT(1, 7) + F(-0.318190f) * AT(3, 7) + F(0.212608f) * AT(5, 7) + F(-0.180240f) * AT(7, 7));
      const Temp_Type X110 = AT(2, 0);
      const Temp_Type X111 = AT(2, 1);
      const Temp_Type X112 = AT(2, 2);
      const Temp_Type X113 = AT(2, 3);
      const Temp_Type X114 = AT(2, 4);
      const Temp_Type X115 = AT(2, 5);
      const Temp_Type X116 = AT(2, 6);
      const Temp_Type X117 = AT(2, 7);
      const Temp_Type X120 = D(F(-0.074658f) * AT(1, 0) + F(0.513280f) * AT(3, 0) + F(0.768178f) * AT(5, 0) + F(-0.375330f) * AT(7, 0));
      const Temp_Type X121 = D(F(-0.074658f) * AT(1, 1) + F(0.513280f) * AT(3, 1) + F(0.768178f) * AT(5, 1) + F(-0.375330f) * AT(7, 1));
      const Temp_Type X122 = D(F(-0.074658f) * AT(1, 2) + F(0.513280f) * AT(3, 2) + F(0.768178f) * AT(5, 2) + F(-0.375330f) * AT(7, 2));
      const Temp_Type X123 = D(F(-0.074658f) * AT(1, 3) + F(0.513280f) * AT(3, 3) + F(0.768178f) * AT(5, 3) + F(-0.375330f) * AT(7, 3));
      const Temp_Type X124 = D(F(-0.074658f) * AT(1, 4) + F(0.513280f) * AT(3, 4) + F(0.768178f) * AT(5, 4) + F(-0.375330f) * AT(7, 4));
      const Temp_Type X125 = D(F(-0.074658f) * AT(1, 5) + F(0.513280f) * AT(3, 5) + F(0.768178f) * AT(5, 5) + F(-0.375330f) * AT(7, 5));
      const Temp_Type X126 = D(F(-0.074658f) * AT(1, 6) + F(0.513280f) * AT(3, 6) + F(0.768178f) * AT(5, 6) + F(-0.375330f) * AT(7, 6));
      const Temp_Type X127 = D(F(-0.074658f) * AT(1, 7) + F(0.513280f) * AT(3, 7) + F(0.768178f) * AT(5, 7) + F(-0.375330f) * AT(7, 7));
      const Temp_Type X130 = AT(6, 0);
      const Temp_Type X131 = AT(6, 1);
      const Temp_Type X132 = AT(6, 2);
      const Temp_Type X133 = AT(6, 3);
      const Temp_Type X134 = AT(6, 4);
      const Temp_Type X135 = AT(6, 5);
      const Temp_Type X136 = AT(6, 6);
      const Temp_Type X137 = AT(6, 7);
      // 80 muls 48 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      R.at(0, 0) = X100;
      R.at(0, 1) = D(X101 * F(0.415735f) + X103 * F(0.791065f) + X105 * F(-0.352443f) + X107 * F(0.277785f));
      R.at(0, 2) = X104;
      R.at(0, 3) = D(X101 * F(0.022887f) + X103 * F(-0.097545f) + X105 * F(0.490393f) + X107 * F(0.865723f));
      R.at(1, 0) = X110;
      R.at(1, 1) = D(X111 * F(0.415735f) + X113 * F(0.791065f) + X115 * F(-0.352443f) + X117 * F(0.277785f));
      R.at(1, 2) = X114;
      R.at(1, 3) = D(X111 * F(0.022887f) + X113 * F(-0.097545f) + X115 * F(0.490393f) + X117 * F(0.865723f));
      R.at(2, 0) = X120;
      R.at(2, 1) = D(X121 * F(0.415735f) + X123 * F(0.791065f) + X125 * F(-0.352443f) + X127 * F(0.277785f));
      R.at(2, 2) = X124;
      R.at(2, 3) = D(X121 * F(0.022887f) + X123 * F(-0.097545f) + X125 * F(0.490393f) + X127 * F(0.865723f));
      R.at(3, 0) = X130;
      R.at(3, 1) = D(X131 * F(0.415735f) + X133 * F(0.791065f) + X135 * F(-0.352443f) + X137 * F(0.277785f));
      R.at(3, 2) = X134;
      R.at(3, 3) = D(X131 * F(0.022887f) + X133 * F(-0.097545f) + X135 * F(0.490393f) + X137 * F(0.865723f));
      // 40 muls 24 adds
      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      S.at(0, 0) = D(X101 * F(0.906127f) + X103 * F(-0.318190f) + X105 * F(0.212608f) + X107 * F(-0.180240f));
      S.at(0, 1) = X102;
      S.at(0, 2) = D(X101 * F(-0.074658f) + X103 * F(0.513280f) + X105 * F(0.768178f) + X107 * F(-0.375330f));
      S.at(0, 3) = X106;
      S.at(1, 0) = D(X111 * F(0.906127f) + X113 * F(-0.318190f) + X115 * F(0.212608f) + X117 * F(-0.180240f));
      S.at(1, 1) = X112;
      S.at(1, 2) = D(X111 * F(-0.074658f) + X113 * F(0.513280f) + X115 * F(0.768178f) + X117 * F(-0.375330f));
      S.at(1, 3) = X116;
      S.at(2, 0) = D(X121 * F(0.906127f) + X123 * F(-0.318190f) + X125 * F(0.212608f) + X127 * F(-0.180240f));
      S.at(2, 1) = X122;
      S.at(2, 2) = D(X121 * F(-0.074658f) + X123 * F(0.513280f) + X125 * F(0.768178f) + X127 * F(-0.375330f));
      S.at(2, 3) = X126;
      S.at(3, 0) = D(X131 * F(0.906127f) + X133 * F(-0.318190f) + X135 * F(0.212608f) + X137 * F(-0.180240f));
      S.at(3, 1) = X132;
      S.at(3, 2) = D(X131 * F(-0.074658f) + X133 * F(0.513280f) + X135 * F(0.768178f) + X137 * F(-0.375330f));
      S.at(3, 3) = X136;
      // 40 muls 24 adds
    }